

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void tests_using_default_checksum_constant(void)

{
  decode_withBadArgs_isUnsuccessful();
  decode_whenCppMethodThrowsException_isUnsuccessful();
  decode_minimalExample_isSuccessful();
  decode_longExample_isSuccessful();
  decode_minimalExampleBadChecksum_isUnsuccessful();
  encode_withBadArgs_isUnsuccessful();
  encode_whenCppMethodThrowsException_isUnsuccessful();
  encode_emptyExample_isUnsuccessful();
  encode_minimalExample_isSuccessful();
  encode_smallExample_isSuccessful();
  decode_and_encode_minimalExample_producesSameResult();
  decode_and_encode_smallExample_producesSameResult();
  decode_and_encode_longExample_producesSameResult();
  return;
}

Assistant:

void tests_using_default_checksum_constant(void) {
    decode_withBadArgs_isUnsuccessful();
    decode_whenCppMethodThrowsException_isUnsuccessful();
    decode_minimalExample_isSuccessful();
    decode_longExample_isSuccessful();
    decode_minimalExampleBadChecksum_isUnsuccessful();

    encode_withBadArgs_isUnsuccessful();
    encode_whenCppMethodThrowsException_isUnsuccessful();
    encode_emptyExample_isUnsuccessful();
    encode_minimalExample_isSuccessful();
    encode_smallExample_isSuccessful();

    decode_and_encode_minimalExample_producesSameResult();
    decode_and_encode_smallExample_producesSameResult();
    decode_and_encode_longExample_producesSameResult();
}